

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O3

string * cmGeneratorExpression::Preprocess
                   (string *__return_storage_ptr__,string *input,PreprocessContext context,
                   bool resolveRelative)

{
  char *pcVar1;
  pointer pbVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char cVar4;
  char cVar5;
  pointer pcVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  size_type sVar10;
  undefined8 *puVar11;
  int iVar12;
  undefined7 in_register_00000009;
  size_type *psVar13;
  ulong uVar14;
  string *psVar15;
  char *pcVar16;
  pointer pbVar17;
  long lVar18;
  bool bVar19;
  string content;
  string result;
  string local_d8;
  pointer *local_b8;
  pointer local_b0;
  pointer local_a8 [2];
  string *local_98;
  string local_90;
  long local_70;
  undefined1 local_68 [40];
  undefined4 local_40;
  PreprocessContext local_3c;
  string *local_38;
  
  local_40 = (undefined4)CONCAT71(in_register_00000009,resolveRelative);
  local_98 = input;
  local_38 = __return_storage_ptr__;
  if (context == StripAllGeneratorExpressions) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    lVar18 = std::__cxx11::string::find((char *)input,0x4d2bcf,0);
    if (lVar18 != -1) {
      paVar3 = &local_d8.field_2;
      psVar15 = input;
LAB_00325d16:
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)psVar15);
      std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar3) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      input = local_98;
      pcVar9 = (psVar15->_M_dataplus)._M_p + lVar18 + 2;
      iVar12 = 1;
      pcVar16 = pcVar9;
      do {
        cVar4 = *pcVar16;
        if (cVar4 == '$') {
          pcVar1 = pcVar16 + 1;
          if (*pcVar1 == '<') {
            pcVar16 = pcVar16 + 1;
          }
          iVar12 = iVar12 + (uint)(*pcVar1 == '<');
        }
        else if (cVar4 == '>') {
          iVar12 = iVar12 + -1;
          if (iVar12 == 0) {
            lVar18 = std::__cxx11::string::find
                               ((char *)local_98,0x4d2bcf,
                                (ulong)(pcVar16 + (lVar18 - (long)pcVar9) + 3));
            psVar15 = input;
            if (lVar18 == -1) break;
            goto LAB_00325d16;
          }
        }
        else if (cVar4 == '\0') goto LAB_00325da0;
        pcVar16 = pcVar16 + 1;
      } while( true );
    }
LAB_00325ebd:
    std::__cxx11::string::substr((ulong)&local_d8,(ulong)input);
    std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
LAB_00325f03:
    psVar15 = local_38;
    StripEmptyListElements(local_38,&local_90);
    goto LAB_00325f18;
  }
  local_3c = context;
  if (InstallInterface < context) {
    __assert_fail("0 && \"cmGeneratorExpression::Preprocess called with invalid args\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorExpression.cxx"
                  ,0x1b5,
                  "static std::string cmGeneratorExpression::Preprocess(const std::string &, PreprocessContext, bool)"
                 );
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  uVar7 = std::__cxx11::string::find((char *)input,0x4d8eeb,0);
  uVar8 = std::__cxx11::string::find((char *)input,0x4d8efe,0);
  if ((uVar8 & uVar7) != 0xffffffffffffffff) {
    psVar15 = local_98;
LAB_003257dd:
    uVar14 = uVar8;
    if (uVar7 < uVar8) {
      uVar14 = uVar7;
    }
    if (uVar8 == 0xffffffffffffffff) {
      uVar14 = uVar7;
    }
    if (uVar7 == 0xffffffffffffffff) {
      uVar14 = uVar8;
    }
    std::__cxx11::string::substr((ulong)&local_d8,(ulong)psVar15);
    std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    pcVar6 = (psVar15->_M_dataplus)._M_p;
    cVar4 = pcVar6[uVar14 + 2];
    local_70 = uVar14 + (ulong)(cVar4 == 'I') * 2 + 0x12;
    pcVar9 = pcVar6 + local_70;
    iVar12 = 1;
    pcVar16 = pcVar9;
LAB_0032586c:
    cVar5 = *pcVar16;
    if (cVar5 == '$') {
      pcVar1 = pcVar16 + 1;
      if (*pcVar1 == '<') {
        pcVar16 = pcVar16 + 1;
      }
      iVar12 = iVar12 + (uint)(*pcVar1 == '<');
LAB_00325899:
      pcVar16 = pcVar16 + 1;
      goto LAB_0032586c;
    }
    if (cVar5 != '>') {
      if (cVar5 == '\0') goto LAB_0032589e;
      goto LAB_00325899;
    }
    iVar12 = iVar12 + -1;
    if (iVar12 != 0) goto LAB_00325899;
    if ((local_3c == BuildInterface) && (cVar4 != 'I')) {
      lVar18 = (long)pcVar16 - (long)pcVar9;
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)psVar15);
      std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d8._M_dataplus._M_p);
      goto LAB_003258f9;
    }
    if ((local_3c == InstallInterface) && (cVar4 == 'I')) {
      lVar18 = (long)pcVar16 - (long)pcVar9;
      std::__cxx11::string::substr((ulong)&local_d8,(ulong)psVar15);
      if ((char)local_40 == '\0') {
        std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d8._M_dataplus._M_p);
      }
      else {
        local_b8 = local_a8;
        local_68._0_8_ = (pointer)0x12;
        local_b8 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_b8,(ulong)local_68);
        local_a8[0] = (pointer)local_68._0_8_;
        *local_b8 = (pointer)0x524f504d495f7b24;
        local_b8[1] = (pointer)0x5849464552505f54;
        *(undefined2 *)(local_b8 + 2) = 0x2f7d;
        local_b0 = (pointer)local_68._0_8_;
        *(char *)((long)local_b8 + local_68._0_8_) = '\0';
        local_68._0_8_ = (string *)0x0;
        local_68._8_8_ = (string *)0x0;
        local_68._16_8_ = (pointer)0x0;
        Split(&local_d8,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_68);
        psVar15 = (string *)local_68._0_8_;
        if (local_68._0_8_ != local_68._8_8_) {
          do {
            std::__cxx11::string::append((char *)&local_90);
            bVar19 = cmsys::SystemTools::FileIsFullPath((psVar15->_M_dataplus)._M_p);
            if ((!bVar19) && (sVar10 = Find(psVar15), sVar10 != 0)) {
              std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_b8);
            }
            std::__cxx11::string::_M_append((char *)&local_90,(ulong)(psVar15->_M_dataplus)._M_p);
            psVar15 = psVar15 + 1;
          } while (psVar15 != (string *)local_68._8_8_);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68);
        psVar15 = local_98;
        if (local_b8 != local_a8) {
          operator_delete(local_b8,(ulong)((long)&(local_a8[0]->_M_dataplus)._M_p + 1));
        }
      }
LAB_003258f9:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      lVar18 = (long)pcVar16 - (long)pcVar9;
    }
    pcVar9 = (char *)(lVar18 + 1);
    bVar19 = true;
    lVar18 = local_70;
    if (*pcVar16 == '\0') goto LAB_00325a9a;
    goto LAB_00325bff;
  }
LAB_00325c6d:
  std::__cxx11::string::substr((ulong)&local_d8,(ulong)local_98);
  std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  goto LAB_00325cb5;
LAB_00325da0:
  std::__cxx11::string::substr((ulong)&local_b8,(ulong)local_98);
  puVar11 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x4d2bcf);
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_d8.field_2._M_allocated_capacity = *psVar13;
    local_d8.field_2._8_8_ = puVar11[3];
    local_d8._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar13;
    local_d8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_d8._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar3) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,(ulong)((long)&(local_a8[0]->_M_dataplus)._M_p + 1));
  }
  input = local_98;
  lVar18 = std::__cxx11::string::find
                     ((char *)local_98,0x4d2bcf,(ulong)(pcVar16 + lVar18 + 2 + (1 - (long)pcVar9)));
  psVar15 = input;
  if (lVar18 == -1) {
    if (iVar12 != 0) goto LAB_00325f03;
    goto LAB_00325ebd;
  }
  goto LAB_00325d16;
LAB_0032589e:
  pcVar9 = pcVar16 + (1 - (long)pcVar9);
  bVar19 = iVar12 == 0;
LAB_00325a9a:
  lVar18 = local_70;
  pcVar16 = "$<BUILD_INTERFACE:";
  if (cVar4 == 'I') {
    pcVar16 = "$<INSTALL_INTERFACE:";
  }
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,pcVar16,pcVar16 + (ulong)(cVar4 == 'I') * 2 + 0x12);
  std::__cxx11::string::substr((ulong)local_68,(ulong)psVar15);
  pbVar17 = (pointer)0xf;
  if (local_b8 != local_a8) {
    pbVar17 = local_a8[0];
  }
  pbVar2 = (pointer)((long)&((_Alloc_hider *)local_68._8_8_)->_M_p +
                    (long)&(local_b0->_M_dataplus)._M_p);
  if (pbVar17 < pbVar2) {
    pbVar17 = (pointer)0xf;
    if ((string *)local_68._0_8_ != (string *)(local_68 + 0x10)) {
      pbVar17 = (pointer)local_68._16_8_;
    }
    if (pbVar2 <= pbVar17) {
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_68,0,(char *)0x0,(ulong)local_b8);
      goto LAB_00325b4e;
    }
  }
  puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,local_68._0_8_);
LAB_00325b4e:
  psVar13 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_d8.field_2._M_allocated_capacity = *psVar13;
    local_d8.field_2._8_8_ = puVar11[3];
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar13;
    local_d8._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_d8._M_string_length = puVar11[1];
  *puVar11 = psVar13;
  puVar11[1] = 0;
  *(undefined1 *)psVar13 = 0;
  std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((string *)local_68._0_8_ != (string *)(local_68 + 0x10)) {
    operator_delete((void *)local_68._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_68._16_8_)->_M_p + 1));
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8,(ulong)((long)&(local_a8[0]->_M_dataplus)._M_p + 1));
  }
LAB_00325bff:
  uVar7 = std::__cxx11::string::find((char *)psVar15,0x4d8eeb,(ulong)(pcVar9 + lVar18));
  uVar8 = std::__cxx11::string::find((char *)psVar15,0x4d8efe,(ulong)(pcVar9 + lVar18));
  if ((uVar8 & uVar7) == 0xffffffffffffffff) goto LAB_00325c66;
  goto LAB_003257dd;
LAB_00325c66:
  if (bVar19) goto LAB_00325c6d;
LAB_00325cb5:
  psVar15 = local_38;
  StripEmptyListElements(local_38,&local_90);
LAB_00325f18:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return psVar15;
}

Assistant:

std::string cmGeneratorExpression::Preprocess(const std::string &input,
                                              PreprocessContext context,
                                              bool resolveRelative)
{
  if (context == StripAllGeneratorExpressions)
    {
    return stripAllGeneratorExpressions(input);
    }
  else if (context == BuildInterface || context == InstallInterface)
    {
    return stripExportInterface(input, context, resolveRelative);
    }

  assert(0 && "cmGeneratorExpression::Preprocess called with invalid args");
  return std::string();
}